

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Targa.cpp
# Opt level: O3

void __thiscall TargaImage::put_pixel(TargaImage *this,rgb color)

{
  rgb *prVar1;
  int iVar2;
  
  prVar1 = this->buffer;
  iVar2 = this->pos;
  prVar1[iVar2].r = color.b;
  prVar1[iVar2].g = color.g;
  prVar1[iVar2].b = color.r;
  iVar2 = iVar2 + 1;
  this->pos = iVar2;
  if (this->buf_size <= iVar2) {
    (*(this->file->super_DataSink)._vptr_DataSink[0xb])(this->file,prVar1,(ulong)(uint)(iVar2 * 3));
    this->pos = 0;
  }
  return;
}

Assistant:

void TargaImage::put_pixel( rgb color )
{
    buffer[pos].r =   color.b; // swap red & blue   colors
    buffer[pos].g =   color.g;
    buffer[pos].b =   color.r;

    if( ++pos >= buf_size ) flush();
}